

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

void * __thiscall QVariant::prepareForEmplace(QVariant *this,QMetaType type)

{
  PrivateShared *ps_00;
  bool bVar1;
  int iVar2;
  size_t align_00;
  QMetaTypeInterface *pQVar3;
  QMetaTypeInterface *in_RSI;
  Private *in_RDI;
  long in_FS_OFFSET;
  qsizetype align;
  PrivateShared *ps;
  anon_class_16_2_3fee0b3d typeFits;
  QVariant newVariant;
  QMetaTypeInterface *in_stack_ffffffffffffff48;
  QMetaTypeInterface *in_stack_ffffffffffffff50;
  anon_class_16_2_3fee0b3d *in_stack_ffffffffffffff70;
  Private *local_50;
  QMetaType local_30;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d_ptr = in_RSI;
  QMetaType::iface(&local_30);
  bVar1 = Private::canUseInternalSpace(in_stack_ffffffffffffff48);
  if (bVar1) {
    clear((QVariant *)in_stack_ffffffffffffff48);
    pQVar3 = QMetaType::iface(&local_30);
    *(ulong *)&in_RDI->field_0x18 =
         *(ulong *)&in_RDI->field_0x18 & 3 | (ulong)pQVar3 & 0xfffffffffffffffc;
    local_50 = in_RDI;
  }
  else if ((((*(ulong *)&in_RDI->field_0x18 & 1) == 0) ||
           (bVar1 = isDetached((QVariant *)in_stack_ffffffffffffff50), !bVar1)) ||
          (bVar1 = prepareForEmplace::anon_class_16_2_3fee0b3d::operator()
                             (in_stack_ffffffffffffff70), !bVar1)) {
    local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
    local_28._0_4_ = 0xaaaaaaaa;
    local_28._4_4_ = 0xaaaaaaaa;
    local_28._8_4_ = 0xaaaaaaaa;
    local_28._12_4_ = 0xaaaaaaaa;
    QVariant((QVariant *)&local_28,local_30.d_ptr);
    swap((QVariant *)in_stack_ffffffffffffff50,(QVariant *)in_stack_ffffffffffffff48);
    local_50 = (Private *)Private::storage((Private *)in_stack_ffffffffffffff50);
    ~QVariant((QVariant *)in_stack_ffffffffffffff50);
  }
  else {
    Private::typeInterface(in_RDI);
    PrivateShared::data((in_RDI->data).shared);
    QtMetaTypePrivate::destruct(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    ps_00 = (in_RDI->data).shared;
    align_00 = QMetaType::alignOf(&local_30);
    iVar2 = PrivateShared::computeOffset(ps_00,align_00);
    ps_00->offset = iVar2;
    pQVar3 = QMetaType::iface(&local_30);
    *(ulong *)&in_RDI->field_0x18 =
         *(ulong *)&in_RDI->field_0x18 & 3 | (ulong)pQVar3 & 0xfffffffffffffffc;
    local_50 = (Private *)PrivateShared::data(ps_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_50;
}

Assistant:

void *QVariant::prepareForEmplace(QMetaType type)
{
    /* There are two cases where we can reuse the existing storage
       (1) The new type fits in QVariant's SBO storage
       (2) We are using the externally allocated storage, the variant is
           detached, and the new type fits into the existing storage.
       In all other cases (3), we cannot reuse the storage.
     */
    auto typeFits = [&] {
        auto newIface = type.iface();
        auto oldIface = d.typeInterface();
        auto newSize = PrivateShared::computeAllocationSize(newIface->size, newIface->alignment);
        auto oldSize = PrivateShared::computeAllocationSize(oldIface->size, oldIface->alignment);
        return newSize <= oldSize;
    };
    if (Private::canUseInternalSpace(type.iface())) { // (1)
        clear();
        d.packedType = quintptr(type.iface()) >> 2;
        return d.data.data;
    } else if (d.is_shared && isDetached() && typeFits()) { // (2)
        QtMetaTypePrivate::destruct(d.typeInterface(), d.data.shared->data());
        // compare QVariant::PrivateShared::create
        const auto ps = d.data.shared;
        const auto align = type.alignOf();
        ps->offset =  PrivateShared::computeOffset(ps, align);
        d.packedType = quintptr(type.iface()) >> 2;
        return ps->data();
    }
    // (3)
    QVariant newVariant(std::in_place, type);
    swap(newVariant);
    // const cast is safe, we're in a non-const method
    return const_cast<void *>(d.storage());
}